

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldUnittest.cpp
# Opt level: O1

void __thiscall
FieldUnittest_FieldMetainfo_Test::~FieldUnittest_FieldMetainfo_Test
          (FieldUnittest_FieldMetainfo_Test *this)

{
  (this->super_FieldUnittest).super_Test._vptr_Test = (_func_int **)&PTR__FieldUnittest_0018eec8;
  ser::Serializer::~Serializer(&(this->super_FieldUnittest).ser);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(FieldUnittest, FieldMetainfo)
{
    fs_register_field(&ser, "field1", 6, "int"   , 3, 4, 42,  1, 80,  1, 3, 3, 0, 0, 0, 1, 0, 0);
    fs_register_field(&ser, "field2", 6, "float", 5, 4,  1, 28, 80, 12, 0, 0, 2, 2, 0, 0, 1, 1);

    // Add some metainfo
    fs_add_field_metainfo_b(&ser, "field1", 6, "FirstField", 10, true);
    fs_add_field_metainfo_d(&ser, "field1", 6, "InitValue", 9, 10.75);
    fs_add_field_metainfo_i(&ser, "field1", 6, "Elements", 8, 42*80);

    fs_add_field_metainfo_b(&ser, "field2", 6, "FirstField", 10, false);
    fs_add_field_metainfo_s(&ser, "field2", 6, "AlternateName", 13, "density", 7);

    // Read metainfo
    ASSERT_EQ(3, ser.FindField("field1").metainfo().size());
    ASSERT_EQ(2, ser.FindField("field2").metainfo().size());

    ASSERT_EQ(true, ser.FindField("field1").metainfo().AsBool("FirstField"));
    ASSERT_EQ(10.75, ser.FindField("field1").metainfo().AsDouble("InitValue"));
    ASSERT_EQ(42*80, ser.FindField("field1").metainfo().AsInt("Elements"));
    ASSERT_EQ(false, ser.FindField("field2").metainfo().AsBool("FirstField"));
    ASSERT_EQ(std::string("density"), ser.FindField("field2").metainfo().AsString("AlternateName"));
}